

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

bool __thiscall CLI::App::check_name(App *this,string *name_to_check)

{
  string *__str;
  __type _Var1;
  bool bVar2;
  pointer __str_00;
  string les;
  string local_name;
  string local_158;
  pointer local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  __str = &this->name_;
  ::std::__cxx11::string::string((string *)&local_130,__str);
  if (this->ignore_underscore_ == true) {
    ::std::__cxx11::string::string((string *)&local_b0,__str);
    detail::remove_underscore(&local_158,&local_b0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_130,&local_158);
    ::std::__cxx11::string::~string((string *)&local_158);
    ::std::__cxx11::string::~string((string *)&local_b0);
    ::std::__cxx11::string::string((string *)&local_d0,name_to_check);
    detail::remove_underscore(&local_158,&local_d0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (name_to_check,&local_158);
    ::std::__cxx11::string::~string((string *)&local_158);
    ::std::__cxx11::string::~string((string *)&local_d0);
  }
  if (this->ignore_case_ == true) {
    ::std::__cxx11::string::string((string *)&local_f0,__str);
    detail::to_lower(&local_158,&local_f0);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (&local_130,&local_158);
    ::std::__cxx11::string::~string((string *)&local_158);
    ::std::__cxx11::string::~string((string *)&local_f0);
    ::std::__cxx11::string::string((string *)&local_110,name_to_check);
    detail::to_lower(&local_158,&local_110);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (name_to_check,&local_158);
    ::std::__cxx11::string::~string((string *)&local_158);
    ::std::__cxx11::string::~string((string *)&local_110);
  }
  _Var1 = ::std::operator==(&local_130,name_to_check);
  bVar2 = true;
  if (!_Var1) {
    __str_00 = (this->aliases_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    local_138 = (this->aliases_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    do {
      bVar2 = __str_00 != local_138;
      if (__str_00 == local_138) break;
      ::std::__cxx11::string::string((string *)&local_158,__str_00);
      if (this->ignore_underscore_ == true) {
        ::std::__cxx11::string::string((string *)&local_70,&local_158);
        detail::remove_underscore(&local_50,&local_70);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_158,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_70);
      }
      if (this->ignore_case_ == true) {
        ::std::__cxx11::string::string((string *)&local_90,&local_158);
        detail::to_lower(&local_50,&local_90);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_158,&local_50);
        ::std::__cxx11::string::~string((string *)&local_50);
        ::std::__cxx11::string::~string((string *)&local_90);
      }
      _Var1 = ::std::operator==(&local_158,name_to_check);
      ::std::__cxx11::string::~string((string *)&local_158);
      __str_00 = __str_00 + 1;
    } while (!_Var1);
  }
  ::std::__cxx11::string::~string((string *)&local_130);
  return bVar2;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE bool App::check_name(std::string name_to_check) const {
    std::string local_name = name_;
    if(ignore_underscore_) {
        local_name = detail::remove_underscore(name_);
        name_to_check = detail::remove_underscore(name_to_check);
    }
    if(ignore_case_) {
        local_name = detail::to_lower(name_);
        name_to_check = detail::to_lower(name_to_check);
    }

    if(local_name == name_to_check) {
        return true;
    }
    for(std::string les : aliases_) {  // NOLINT(performance-for-range-copy)
        if(ignore_underscore_) {
            les = detail::remove_underscore(les);
        }
        if(ignore_case_) {
            les = detail::to_lower(les);
        }
        if(les == name_to_check) {
            return true;
        }
    }
    return false;
}